

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void transferParseError(Parse *pTo,Parse *pFrom)

{
  sqlite3 *in_RSI;
  long in_RDI;
  void *in_stack_ffffffffffffffe8;
  
  if (*(int *)(in_RDI + 0x34) == 0) {
    *(Vdbe **)(in_RDI + 8) = in_RSI->pVdbe;
    *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)((long)&in_RSI->flags + 4);
    *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)&in_RSI->mutex;
  }
  else {
    sqlite3DbFree(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static void transferParseError(Parse *pTo, Parse *pFrom){
  assert( pFrom->zErrMsg==0 || pFrom->nErr );
  assert( pTo->zErrMsg==0 || pTo->nErr );
  if( pTo->nErr==0 ){
    pTo->zErrMsg = pFrom->zErrMsg;
    pTo->nErr = pFrom->nErr;
    pTo->rc = pFrom->rc;
  }else{
    sqlite3DbFree(pFrom->db, pFrom->zErrMsg);
  }
}